

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O0

void __thiscall create::Serial::~Serial(Serial *this)

{
  Serial *this_local;
  
  this->_vptr_Serial = (_func_int **)&PTR___cxa_pure_virtual_00200240;
  disconnect(this);
  std::shared_ptr<create::Data>::~shared_ptr(&this->data);
  std::function<void_()>::~function(&this->callback);
  std::condition_variable::~condition_variable(&this->dataReadyCond);
  std::thread::~thread(&this->ioThread);
  boost::asio::
  basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~basic_serial_port(&this->port);
  boost::asio::
  basic_signal_set<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~basic_signal_set(&this->signals);
  boost::asio::io_context::~io_context(&this->io);
  std::enable_shared_from_this<create::Serial>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<create::Serial>);
  return;
}

Assistant:

Serial::~Serial() {
    disconnect();
  }